

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistview_p.h
# Opt level: O2

QList<QModelIndex> * __thiscall
QListViewPrivate::intersectingSet
          (QList<QModelIndex> *__return_storage_ptr__,QListViewPrivate *this,QRect *area,
          bool doLayout)

{
  bool bVar1;
  undefined7 in_register_00000009;
  long in_FS_OFFSET;
  QRect local_48;
  QRect local_38;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if ((int)CONCAT71(in_register_00000009,doLayout) != 0) {
    QAbstractItemViewPrivate::executePostedLayout(&this->super_QAbstractItemViewPrivate);
  }
  bVar1 = QWidget::isRightToLeft
                    (*(QWidget **)
                      &(this->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.
                       super_QFramePrivate.super_QWidgetPrivate.field_0x8);
  local_38 = (QRect)QRect::normalized();
  if (bVar1) {
    local_48 = local_38;
    local_38 = flipX(this,&local_48);
  }
  (*this->commonListView->_vptr_QCommonListViewBase[7])
            (__return_storage_ptr__,this->commonListView,&local_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

inline QList<QModelIndex> intersectingSet(const QRect &area, bool doLayout = true) const
    {
        if (doLayout) executePostedLayout();
        QRect a = (q_func()->isRightToLeft() ? flipX(area.normalized()) : area.normalized());
        return commonListView->intersectingSet(a);
    }